

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_0::isAdvancedBlendEq(BlendEq eq)

{
  bool local_9;
  BlendEq eq_local;
  
  switch(eq) {
  case 0x9294:
    local_9 = true;
    break;
  case 0x9295:
    local_9 = true;
    break;
  case 0x9296:
    local_9 = true;
    break;
  case 0x9297:
    local_9 = true;
    break;
  case 0x9298:
    local_9 = true;
    break;
  case 0x9299:
    local_9 = true;
    break;
  case 0x929a:
    local_9 = true;
    break;
  case 0x929b:
    local_9 = true;
    break;
  case 0x929c:
    local_9 = true;
    break;
  default:
    local_9 = false;
    break;
  case 0x929e:
    local_9 = true;
    break;
  case 0x92a0:
    local_9 = true;
    break;
  case 0x92ad:
    local_9 = true;
    break;
  case 0x92ae:
    local_9 = true;
    break;
  case 0x92af:
    local_9 = true;
    break;
  case 0x92b0:
    local_9 = true;
  }
  return local_9;
}

Assistant:

bool isAdvancedBlendEq (BlendEq eq)
{
	switch (eq)
	{
		case GL_MULTIPLY:		return true;
		case GL_SCREEN:			return true;
		case GL_OVERLAY:		return true;
		case GL_DARKEN:			return true;
		case GL_LIGHTEN:		return true;
		case GL_COLORDODGE:		return true;
		case GL_COLORBURN:		return true;
		case GL_HARDLIGHT:		return true;
		case GL_SOFTLIGHT:		return true;
		case GL_DIFFERENCE:		return true;
		case GL_EXCLUSION:		return true;
		case GL_HSL_HUE:		return true;
		case GL_HSL_SATURATION:	return true;
		case GL_HSL_COLOR:		return true;
		case GL_HSL_LUMINOSITY:	return true;
		default:
			return false;
	}
}